

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

int __thiscall mp::internal::TextReader<fmt::Locale>::ReadInt<int>(TextReader<fmt::Locale> *this)

{
  bool bVar1;
  int value;
  int local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_18;
  
  local_2c = 0;
  bVar1 = DoReadOptionalInt<int>(this,&local_2c);
  if (!bVar1) {
    local_18.field_1.values_ = (Value *)&local_28;
    local_28 = 0;
    uStack_20 = 0;
    local_18.types_ = 0;
    DoReportError(this,(this->super_ReaderBase).token_,(CStringRef)0x173518,&local_18);
  }
  return local_2c;
}

Assistant:

Int ReadInt() {
    Int value = 0;
    if (!DoReadOptionalInt(value))
      ReportError("expected integer");
    return value;
  }